

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnObj.c
# Opt level: O0

int Wln_ObjAlloc(Wln_Ntk_t *p,int Type,int Signed,int End,int Beg)

{
  int i;
  int iVar1;
  Wln_Vec_t *local_30;
  int iObj;
  int Beg_local;
  int End_local;
  int Signed_local;
  int Type_local;
  Wln_Ntk_t *p_local;
  
  i = Vec_IntSize(&p->vTypes);
  iVar1 = Vec_IntCap(&p->vTypes);
  if (i == iVar1) {
    if (p->vFanins == (Wln_Vec_t *)0x0) {
      local_30 = (Wln_Vec_t *)malloc((long)(i << 1) << 4);
    }
    else {
      local_30 = (Wln_Vec_t *)realloc(p->vFanins,(long)(i << 1) << 4);
    }
    p->vFanins = local_30;
    memset(p->vFanins + i,0,(long)i << 4);
    Vec_IntGrow(&p->vTypes,i << 1);
  }
  iVar1 = Vec_StrSize(&p->vSigns);
  if (i == iVar1) {
    iVar1 = Vec_IntSize(&p->vRanges);
    if (i == iVar1) {
      Vec_IntPush(&p->vTypes,Type);
      Vec_StrPush(&p->vSigns,(char)Signed);
      iVar1 = Hash_Int2ManInsert(p->pRanges,End,Beg,0);
      Vec_IntPush(&p->vRanges,iVar1);
      iVar1 = Wln_ObjIsCi(p,i);
      if (iVar1 != 0) {
        iVar1 = Vec_IntSize(&p->vCis);
        Wln_ObjSetFanin(p,i,1,iVar1);
        Vec_IntPush(&p->vCis,i);
      }
      iVar1 = Wln_ObjIsCo(p,i);
      if (iVar1 != 0) {
        iVar1 = Vec_IntSize(&p->vCos);
        Wln_ObjSetFanin(p,i,1,iVar1);
        Vec_IntPush(&p->vCos,i);
      }
      iVar1 = Wln_ObjIsFf(p,i);
      if (iVar1 != 0) {
        Vec_IntPush(&p->vFfs,i);
      }
      p->nObjs[Type] = p->nObjs[Type] + 1;
      return i;
    }
    __assert_fail("iObj == Vec_IntSize(&p->vRanges)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnObj.c"
                  ,0x73,"int Wln_ObjAlloc(Wln_Ntk_t *, int, int, int, int)");
  }
  __assert_fail("iObj == Vec_StrSize(&p->vSigns)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnObj.c"
                ,0x72,"int Wln_ObjAlloc(Wln_Ntk_t *, int, int, int, int)");
}

Assistant:

int Wln_ObjAlloc( Wln_Ntk_t * p, int Type, int Signed, int End, int Beg )
{
    int iObj = Vec_IntSize(&p->vTypes);
    if ( iObj == Vec_IntCap(&p->vTypes) )
    {
        p->vFanins = ABC_REALLOC( Wln_Vec_t, p->vFanins, 2 * iObj );
        memset( p->vFanins + iObj, 0, sizeof(Wln_Vec_t) * iObj );
        Vec_IntGrow( &p->vTypes, 2 * iObj );
    }
    assert( iObj == Vec_StrSize(&p->vSigns) );
    assert( iObj == Vec_IntSize(&p->vRanges) );
    Vec_IntPush( &p->vTypes, Type );
    Vec_StrPush( &p->vSigns, (char)Signed );
    Vec_IntPush( &p->vRanges, Hash_Int2ManInsert(p->pRanges, End, Beg, 0) );
    if ( Wln_ObjIsCi(p, iObj) ) Wln_ObjSetFanin( p, iObj, 1, Vec_IntSize(&p->vCis) ), Vec_IntPush( &p->vCis, iObj );
    if ( Wln_ObjIsCo(p, iObj) ) Wln_ObjSetFanin( p, iObj, 1, Vec_IntSize(&p->vCos) ), Vec_IntPush( &p->vCos, iObj );
    if ( Wln_ObjIsFf(p, iObj) ) Vec_IntPush( &p->vFfs, iObj );
    p->nObjs[Type]++;
    return iObj;
}